

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

int getWindowState(_GLFWwindow *window)

{
  unsigned_long uVar1;
  anon_struct_16_2_032570bf *state;
  int result;
  uchar **in_stack_00000030;
  Atom in_stack_00000038;
  Atom in_stack_00000040;
  Window in_stack_00000048;
  undefined4 local_c;
  
  local_c = 0;
  uVar1 = _glfwGetWindowPropertyX11
                    (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030);
  if (1 < uVar1) {
    local_c = iRam0000000000000000;
  }
  return local_c;
}

Assistant:

static int getWindowState(_GLFWwindow* window)
{
    int result = WithdrawnState;
    struct {
        CARD32 state;
        Window icon;
    } *state = NULL;

    if (_glfwGetWindowPropertyX11(window->x11.handle,
                                  _glfw.x11.WM_STATE,
                                  _glfw.x11.WM_STATE,
                                  (unsigned char**) &state) >= 2)
    {
        result = state->state;
    }

    if (state)
        XFree(state);

    return result;
}